

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

void __thiscall embree::CommandLine::CommandLine(CommandLine *this,int argc,char **argv)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  long lVar1;
  pair<std::__detail::_Node_iterator<std::unique_ptr<std::vector<char_*,_std::allocator<char_*>_>,_std::default_delete<std::vector<char_*,_std::allocator<char_*>_>_>_>,_true,_false>,_bool>
  pVar2;
  pair<std::__detail::_Node_iterator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false>,_bool>
  pVar3;
  allocator local_39;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  
  this->cl = (vector<char_*,_std::allocator<char_*>_> *)0x0;
  local_38._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)::operator_new(0x18);
  ((local_38._M_head_impl)->field_2)._M_allocated_capacity = 0;
  ((local_38._M_head_impl)->_M_dataplus)._M_p = (pointer)0x0;
  (local_38._M_head_impl)->_M_string_length = 0;
  pVar2 = std::
          _Hashtable<std::unique_ptr<std::vector<char*,std::allocator<char*>>,std::default_delete<std::vector<char*,std::allocator<char*>>>>,std::unique_ptr<std::vector<char*,std::allocator<char*>>,std::default_delete<std::vector<char*,std::allocator<char*>>>>,std::allocator<std::unique_ptr<std::vector<char*,std::allocator<char*>>,std::default_delete<std::vector<char*,std::allocator<char*>>>>>,std::__detail::_Identity,std::equal_to<std::unique_ptr<std::vector<char*,std::allocator<char*>>,std::default_delete<std::vector<char*,std::allocator<char*>>>>>,std::hash<std::unique_ptr<std::vector<char*,std::allocator<char*>>,std::default_delete<std::vector<char*,std::allocator<char*>>>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_emplace<std::unique_ptr<std::vector<char*,std::allocator<char*>>,std::default_delete<std::vector<char*,std::allocator<char*>>>>>
                    ((_Hashtable<std::unique_ptr<std::vector<char*,std::allocator<char*>>,std::default_delete<std::vector<char*,std::allocator<char*>>>>,std::unique_ptr<std::vector<char*,std::allocator<char*>>,std::default_delete<std::vector<char*,std::allocator<char*>>>>,std::allocator<std::unique_ptr<std::vector<char*,std::allocator<char*>>,std::default_delete<std::vector<char*,std::allocator<char*>>>>>,std::__detail::_Identity,std::equal_to<std::unique_ptr<std::vector<char*,std::allocator<char*>>,std::default_delete<std::vector<char*,std::allocator<char*>>>>>,std::hash<std::unique_ptr<std::vector<char*,std::allocator<char*>>,std::default_delete<std::vector<char*,std::allocator<char*>>>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)command_line_pool);
  std::
  unique_ptr<std::vector<char_*,_std::allocator<char_*>_>,_std::default_delete<std::vector<char_*,_std::allocator<char_*>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<char_*,_std::allocator<char_*>_>,_std::default_delete<std::vector<char_*,_std::allocator<char_*>_>_>_>
                 *)&local_38);
  this->cl = *(vector<char_*,_std::allocator<char_*>_> **)
              ((long)pVar2.first.
                     super__Node_iterator_base<std::unique_ptr<std::vector<char_*,_std::allocator<char_*>_>,_std::default_delete<std::vector<char_*,_std::allocator<char_*>_>_>_>,_false>
                     ._M_cur.
                     super__Node_iterator_base<std::unique_ptr<std::vector<char_*,_std::allocator<char_*>_>,_std::default_delete<std::vector<char_*,_std::allocator<char_*>_>_>_>,_false>
              + 8);
  for (lVar1 = 0; argc != lVar1; lVar1 = lVar1 + 1) {
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ::operator_new(0x20);
    std::__cxx11::string::string((string *)this_00,argv[lVar1],&local_39);
    local_38._M_head_impl = this_00;
    pVar3 = std::
            _Hashtable<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>,std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>,std::allocator<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>,std::__detail::_Identity,std::equal_to<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>,std::hash<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_emplace<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>
                      ((_Hashtable<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>,std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>,std::allocator<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>,std::__detail::_Identity,std::equal_to<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>,std::hash<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)string_pool_abi_cxx11_,&local_38);
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_38);
    local_38._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         **(undefined8 **)
           ((long)pVar3.first.
                  super__Node_iterator_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
                  ._M_cur.
                  super__Node_iterator_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
           + 8);
    std::vector<char*,std::allocator<char*>>::emplace_back<char*>
              ((vector<char*,std::allocator<char*>> *)this->cl,(char **)&local_38);
  }
  return;
}

Assistant:

CommandLine(int argc, char** argv) : cl(nullptr)
  {
    auto cl_iter = command_line_pool.emplace(std::unique_ptr<std::vector<char*>>(new std::vector<char*>()));
    cl = cl_iter.first->get();
    for (size_t i = 0; i < argc; ++i) {
      auto pair = string_pool.emplace(std::unique_ptr<std::string>{new std::string(argv[i])});
      cl->emplace_back(&(*pair.first->get())[0]);
    }
  }